

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::isFieldValue(DataDictionary *this,int field,string *value)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_98 [3];
  _Self local_80;
  undefined1 local_78 [8];
  string singleValue;
  size_type endPos;
  size_type startPos;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  string *value_local;
  DataDictionary *pDStack_18;
  int field_local;
  DataDictionary *this_local;
  
  i._M_node = (_Base_ptr)value;
  value_local._4_4_ = field;
  pDStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find(&this->m_fieldValues,(key_type *)((long)&value_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end(&this->m_fieldValues);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = isMultipleValueField(this,value_local._4_4_);
    if (bVar1) {
      singleValue.field_2._8_8_ = 0;
      do {
        singleValue.field_2._8_8_ = std::__cxx11::string::find_first_of((char)i._M_node,0x20);
        std::__cxx11::string::substr((ulong)local_78,(ulong)i._M_node);
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&local_30);
        local_80._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&ppVar2->second,(key_type *)local_78);
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&local_30);
        local_98[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&ppVar2->second);
        bVar1 = std::operator==(&local_80,local_98);
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        std::__cxx11::string::~string((string *)local_78);
        if (bVar1) goto LAB_00221b57;
      } while (singleValue.field_2._8_8_ != -1);
      this_local._7_1_ = 1;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_30);
      local_40._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&ppVar2->second,i._M_node);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_30);
      startPos = (size_type)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&ppVar2->second);
      this_local._7_1_ = std::operator!=(&local_40,(_Self *)&startPos);
    }
  }
LAB_00221b57:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isFieldValue(int field, const std::string &value) const {
    FieldToValue::const_iterator i = m_fieldValues.find(field);
    if (i == m_fieldValues.end()) {
      return false;
    }
    if (!isMultipleValueField(field)) {
      return i->second.find(value) != i->second.end();
    }

    // MultipleValue
    std::string::size_type startPos = 0;
    std::string::size_type endPos = 0;
    do {
      endPos = value.find_first_of(' ', startPos);
      std::string singleValue = value.substr(startPos, endPos - startPos);
      if (i->second.find(singleValue) == i->second.end()) {
        return false;
      }
      startPos = endPos + 1;
    } while (endPos != std::string::npos);
    return true;
  }